

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

void apx_client_disconnect(apx_client_t *self)

{
  if ((self != (apx_client_t *)0x0) && (self->connection != (apx_clientConnection_t *)0x0)) {
    apx_connectionBase_close(&self->connection->base);
    apx_connectionBase_stop(&self->connection->base);
    pthread_mutex_lock((pthread_mutex_t *)&self->lock);
    self->is_connected = false;
    pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
    return;
  }
  return;
}

Assistant:

void apx_client_disconnect(apx_client_t *self)
{
   if ( (self != NULL) && (self->connection != 0))
   {
      apx_connectionBase_close(&self->connection->base);
      apx_connectionBase_stop(&self->connection->base);
      MUTEX_LOCK(self->lock);
      self->is_connected = false;
      MUTEX_UNLOCK(self->lock);
   }
}